

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O2

void __thiscall
Rml::ElementDocument::ProcessHeader(ElementDocument *this,DocumentHeader *document_header)

{
  Vector2f vp_dimensions;
  pointer pRVar1;
  UniquePtr<Rml::StreamMemory> this_00;
  bool bVar2;
  String *name;
  Template *this_01;
  DocumentHeader *header_00;
  StyleSheetContainer *container;
  Vector2i VVar3;
  ulong uVar4;
  long lVar5;
  pointer pRVar6;
  Resource *script;
  float dp_ratio;
  float fVar7;
  float fVar8;
  SharedPtr<StyleSheetContainer> new_style_sheet;
  UniquePtr<Rml::StreamMemory> stream;
  SharedPtr<Rml::StyleSheetContainer> inline_sheet;
  SharedPtr<StyleSheetContainer> local_200;
  DocumentHeader header;
  URL local_168;
  
  ::std::__cxx11::string::_M_assign((string *)&this->source_url);
  header.source._M_dataplus._M_p = (pointer)&header.source.field_2;
  header.source._M_string_length = 0;
  header.source.field_2._M_local_buf[0] = '\0';
  header.title._M_dataplus._M_p = (pointer)&header.title.field_2;
  header.title._M_string_length = 0;
  header.title.field_2._M_local_buf[0] = '\0';
  header.template_resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  header.template_resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  header.template_resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  header.rcss.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  header.rcss.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  header.rcss.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  header.scripts.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  header.scripts.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  header.scripts.
  super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DocumentHeader::MergePaths
            (&header,&header.template_resources,&document_header->template_resources,
             &document_header->source);
  lVar5 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)header.template_resources.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)header.template_resources.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
    URL::URL(&local_168,
             (String *)
             ((long)&((header.template_resources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
    name = URL::GetURL_abi_cxx11_(&local_168);
    this_01 = TemplateCache::LoadTemplate(name);
    URL::~URL(&local_168);
    if (this_01 == (Template *)0x0) {
      Log::Message(LT_WARNING,"Template %s not found",
                   *(undefined8 *)
                    ((long)&((header.template_resources.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5)
                  );
    }
    else {
      header_00 = Template::GetHeader(this_01);
      DocumentHeader::MergeHeader(&header,header_00);
    }
    lVar5 = lVar5 + 0x20;
  }
  DocumentHeader::MergeHeader(&header,document_header);
  ::std::__cxx11::string::_M_assign((string *)&this->title);
  pRVar1 = header.rcss.
           super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  new_style_sheet.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  new_style_sheet.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  for (pRVar6 = header.rcss.
                super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar6 != pRVar1; pRVar6 = pRVar6 + 1) {
    if (pRVar6->is_inline == true) {
      ::std::make_shared<Rml::StyleSheetContainer>();
      local_168.url._M_dataplus._M_p = (pRVar6->content)._M_dataplus._M_p;
      ::std::make_unique<Rml::StreamMemory,unsigned_char_const*,unsigned_long>
                ((uchar **)&stream,(unsigned_long *)&local_168);
      this_00 = stream;
      URL::URL(&local_168,&pRVar6->path);
      StreamMemory::SetSourceURL
                ((StreamMemory *)
                 this_00._M_t.
                 super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                 .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl,&local_168);
      URL::~URL(&local_168);
      bVar2 = StyleSheetContainer::LoadStyleSheetContainer
                        (inline_sheet.
                         super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,(Stream *)
                                stream._M_t.
                                super___uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Rml::StreamMemory_*,_std::default_delete<Rml::StreamMemory>_>
                                .super__Head_base<0UL,_Rml::StreamMemory_*,_false>._M_head_impl,
                         pRVar6->line);
      if (bVar2) {
        if (new_style_sheet.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          ::std::__shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&new_style_sheet.
                      super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>,
                     &inline_sheet.
                      super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>);
        }
        else {
          StyleSheetContainer::MergeStyleSheetContainer
                    (new_style_sheet.
                     super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,inline_sheet.
                      super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
        }
      }
      ::std::__uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::reset
                ((__uniq_ptr_impl<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> *)
                 &stream,(pointer)0x0);
      ::std::unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_>::~unique_ptr
                ((unique_ptr<Rml::StreamMemory,_std::default_delete<Rml::StreamMemory>_> *)&stream);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&inline_sheet.
                  super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      container = StyleSheetFactory::GetStyleSheetContainer(&pRVar6->path);
      if (container == (StyleSheetContainer *)0x0) {
        Log::Message(LT_ERROR,"Failed to load style sheet %s.",(pRVar6->path)._M_dataplus._M_p);
      }
      else if (new_style_sheet.
               super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
               (element_type *)0x0) {
        StyleSheetContainer::StyleSheetContainer((StyleSheetContainer *)&local_168);
        StyleSheetContainer::CombineStyleSheetContainer
                  ((StyleSheetContainer *)&inline_sheet,container);
        ::std::__shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&new_style_sheet.
                    super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2> *)
                   &inline_sheet);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&inline_sheet.
                    super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        StyleSheetContainer::~StyleSheetContainer((StyleSheetContainer *)&local_168);
      }
      else {
        StyleSheetContainer::MergeStyleSheetContainer
                  (new_style_sheet.
                   super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   container);
      }
    }
  }
  pRVar6 = header.scripts.
           super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = header.scripts.
           super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (new_style_sheet.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    local_200.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         new_style_sheet.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_200.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = new_style_sheet.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
    new_style_sheet.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    new_style_sheet.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    SetStyleSheetContainer(this,&local_200);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_200.super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pRVar6 = header.scripts.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar1 = header.scripts.
             super__Vector_base<Rml::DocumentHeader::Resource,_std::allocator<Rml::DocumentHeader::Resource>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pRVar6 != pRVar1; pRVar6 = pRVar6 + 1) {
    if (pRVar6->is_inline == true) {
      (*(this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable[0x18])
                (this,&pRVar6->content,pRVar6,(ulong)(uint)pRVar6->line);
    }
    else {
      (*(this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable[0x19])
                (this,pRVar6);
    }
  }
  Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>((Property *)&local_168,Hidden);
  Element::SetProperty(&this->super_Element,Visibility,(Property *)&local_168);
  Property::~Property((Property *)&local_168);
  if (this->context == (Context *)0x0) {
    dp_ratio = 1.0;
  }
  else {
    dp_ratio = Context::GetDensityIndependentPixelRatio(this->context);
    if (this->context != (Context *)0x0) {
      VVar3 = Context::GetDimensions(this->context);
      fVar8 = (float)VVar3.x;
      fVar7 = (float)VVar3.y;
      goto LAB_0028d138;
    }
  }
  fVar8 = 1.0;
  fVar7 = 1.0;
LAB_0028d138:
  vp_dimensions.y = fVar7;
  vp_dimensions.x = fVar8;
  Element::UpdateProperties(&this->super_Element,dp_ratio,vp_dimensions);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_style_sheet.
              super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  DocumentHeader::~DocumentHeader(&header);
  return;
}

Assistant:

void ElementDocument::ProcessHeader(const DocumentHeader* document_header)
{
	RMLUI_ZoneScoped;

	// Store the source address that we came from
	source_url = document_header->source;

	// Construct a new header and copy the template details across
	DocumentHeader header;
	header.MergePaths(header.template_resources, document_header->template_resources, document_header->source);

	// Merge in any templates, note a merge may cause more templates to merge
	for (size_t i = 0; i < header.template_resources.size(); i++)
	{
		Template* merge_template = TemplateCache::LoadTemplate(URL(header.template_resources[i]).GetURL());

		if (merge_template)
			header.MergeHeader(*merge_template->GetHeader());
		else
			Log::Message(Log::LT_WARNING, "Template %s not found", header.template_resources[i].c_str());
	}

	// Merge the document's header last, as it is the most overriding.
	header.MergeHeader(*document_header);

	// Set the title to the document title.
	title = document_header->title;

	// If a style-sheet (or sheets) has been specified for this element, then we load them and set the combined sheet
	// on the element; all of its children will inherit it by default.
	SharedPtr<StyleSheetContainer> new_style_sheet;

	// Combine any inline sheets.
	for (const DocumentHeader::Resource& rcss : header.rcss)
	{
		if (rcss.is_inline)
		{
			auto inline_sheet = MakeShared<StyleSheetContainer>();
			auto stream = MakeUnique<StreamMemory>((const byte*)rcss.content.c_str(), rcss.content.size());
			stream->SetSourceURL(rcss.path);

			if (inline_sheet->LoadStyleSheetContainer(stream.get(), rcss.line))
			{
				if (new_style_sheet)
					new_style_sheet->MergeStyleSheetContainer(*inline_sheet);
				else
					new_style_sheet = std::move(inline_sheet);
			}

			stream.reset();
		}
		else
		{
			const StyleSheetContainer* sub_sheet = StyleSheetFactory::GetStyleSheetContainer(rcss.path);
			if (sub_sheet)
			{
				if (new_style_sheet)
					new_style_sheet->MergeStyleSheetContainer(*sub_sheet);
				else
					new_style_sheet = sub_sheet->CombineStyleSheetContainer(StyleSheetContainer());
			}
			else
				Log::Message(Log::LT_ERROR, "Failed to load style sheet %s.", rcss.path.c_str());
		}
	}

	// If a style sheet is available, set it on the document.
	if (new_style_sheet)
		SetStyleSheetContainer(std::move(new_style_sheet));

	// Load scripts.
	for (const DocumentHeader::Resource& script : header.scripts)
	{
		if (script.is_inline)
		{
			LoadInlineScript(script.content, script.path, script.line);
		}
		else
		{
			LoadExternalScript(script.path);
		}
	}

	// Hide this document.
	SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));

	const float dp_ratio = (context ? context->GetDensityIndependentPixelRatio() : 1.0f);
	const Vector2f vp_dimensions = (context ? Vector2f(context->GetDimensions()) : Vector2f(1.0f));

	// Update properties so that e.g. visibility status can be queried properly immediately.
	UpdateProperties(dp_ratio, vp_dimensions);
}